

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void sel_object_proc(Am_Object *inter,int mouse_x,int mouse_y,Am_Object *ref_obj,Am_Input_Char ic)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_String local_140;
  Am_Value local_138;
  Am_Value local_128;
  Am_Value local_118;
  undefined1 local_108 [8];
  Am_Value obj_value;
  Am_Value old_value;
  Am_Object local_e0;
  undefined1 local_d8 [8];
  Am_Value_List list;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object diff_obj;
  Am_Where_Method method;
  undefined1 local_90 [7];
  bool abort_ok;
  Am_Value value;
  Am_Object local_68;
  byte local_59;
  undefined1 local_58 [7];
  bool toggle_in_set;
  Am_Value new_value;
  Am_Object widget;
  Am_Object local_30;
  Am_Object new_object;
  Am_Object *ref_obj_local;
  int mouse_y_local;
  int mouse_x_local;
  Am_Object *inter_local;
  Am_Input_Char ic_local;
  
  new_object.data = (Am_Object_Data *)ref_obj;
  Am_Object::Am_Object(&local_30);
  bVar1 = Am_Object::Valid(inter);
  if (!bVar1) goto LAB_0033930f;
  Am_Object::Get_Owner((Am_Object *)&new_value.value,(Am_Slot_Flags)inter);
  clear_multi_selections((Am_Object *)&new_value.value);
  pAVar2 = Am_Object::Get(inter,0x11a,0);
  Am_Object::operator=(&local_30,pAVar2);
  bVar1 = Am_Object::Valid(&local_30);
  if (bVar1) {
    Am_Value::Am_Value((Am_Value *)local_58);
    inter_local._6_1_ = ic._2_1_;
    local_59 = inter_local._6_1_ & 1;
    bVar1 = Am_Object::operator==(&local_30,(Am_Object *)&new_value.value);
    if (bVar1) {
      if ((local_59 & 1) == 0) {
        Am_Object::operator=(&local_30,(Am_Object_Data *)0x0);
        Am_Value_List::Am_Value_List((Am_Value_List *)&value.value);
        pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&value.value);
        Am_Value::operator=((Am_Value *)local_58,pAVar3);
        Am_Value_List::~Am_Value_List((Am_Value_List *)&value.value);
        goto LAB_003390ad;
      }
      Am_Object::Am_Object(&local_68,inter);
      Am_Abort_Interactor(&local_68,true);
      Am_Object::~Am_Object(&local_68);
    }
    else {
      Am_Value::Am_Value((Am_Value *)local_90);
      pAVar2 = Am_Object::Peek((Am_Object *)&new_value.value,0x1a3,0);
      Am_Value::operator=((Am_Value *)local_90,pAVar2);
      method.Call._7_1_ = true;
      bVar1 = Am_Value::Valid((Am_Value *)local_90);
      if (bVar1) {
        pAVar2 = Am_Object::Get((Am_Object *)&new_value.value,0x1a6,0);
        Am_Where_Method::Am_Where_Method((Am_Where_Method *)&diff_obj,pAVar2);
        Am_Object::Am_Object(&local_b8,(Am_Object *)&new_value.value);
        Am_Object::Am_Object(&local_c0,&local_30);
        Am_Object::Am_Object((Am_Object *)&list.item,ref_obj);
        (*(code *)method.from_wrapper)(&local_b0,&local_b8,&local_c0,&list.item,mouse_x,mouse_y);
        Am_Object::~Am_Object((Am_Object *)&list.item);
        Am_Object::~Am_Object(&local_c0);
        Am_Object::~Am_Object(&local_b8);
        bVar1 = Am_Object::Valid(&local_b0);
        method.Call._7_1_ = !bVar1;
        Am_Object::~Am_Object(&local_b0);
      }
      Am_Value_List::Am_Value_List((Am_Value_List *)local_d8);
      pAVar2 = Am_Object::Get((Am_Object *)&new_value.value,0x169,0);
      Am_Value_List::operator=((Am_Value_List *)local_d8,pAVar2);
      Am_Value_List::Start((Am_Value_List *)local_d8);
      if ((local_59 & 1) == 0) {
        pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_30);
        bVar1 = Am_Value_List::Member((Am_Value_List *)local_d8,pAVar3);
        if (!bVar1) {
          Am_Value_List::Make_Empty((Am_Value_List *)local_d8);
          pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_30);
          Am_Value_List::Add((Am_Value_List *)local_d8,pAVar3,Am_TAIL,true);
          goto LAB_0033903b;
        }
        if (!method.Call._7_1_) goto LAB_0033903b;
        Am_Object::Am_Object((Am_Object *)&old_value.value,inter);
        Am_Abort_Interactor((Am_Object *)&old_value.value,true);
        Am_Object::~Am_Object((Am_Object *)&old_value.value);
        bVar1 = true;
      }
      else {
        Am_Object::Am_Object(&local_e0,&local_30);
        toggle_object_in_list((Am_Object *)&new_value.value,&local_e0,(Am_Value_List *)local_d8);
        Am_Object::~Am_Object(&local_e0);
LAB_0033903b:
        pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_d8);
        Am_Value::operator=((Am_Value *)local_58,pAVar3);
        bVar1 = false;
      }
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_d8);
      Am_Value::~Am_Value((Am_Value *)local_90);
      if (!bVar1) {
LAB_003390ad:
        Am_Value::Am_Value((Am_Value *)&obj_value.value);
        pAVar2 = Am_Object::Peek((Am_Object *)&new_value.value,0x169,0);
        Am_Value::operator=((Am_Value *)&obj_value.value,pAVar2);
        Am_Object::Set((Am_Object *)&new_value.value,0x169,(Am_Value *)local_58,0);
        pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_30);
        Am_Value::Am_Value((Am_Value *)local_108,pAVar3);
        Am_Value::Am_Value(&local_118,(Am_Value *)local_108);
        Am_Value::Am_Value(&local_128,(Am_Value *)local_58);
        Am_Value::Am_Value(&local_138,(Am_Value *)&obj_value.value);
        Am_String::Am_String(&local_140,"Select",true);
        set_commands_for_sel
                  (&Am_No_Object,inter,(Am_Object *)&new_value.value,&local_118,&local_128,
                   &local_138,true,&local_140,Am_Sel_NONE,false);
        Am_String::~Am_String(&local_140);
        Am_Value::~Am_Value(&local_138);
        Am_Value::~Am_Value(&local_128);
        Am_Value::~Am_Value(&local_118);
        Am_Value::~Am_Value((Am_Value *)local_108);
        Am_Value::~Am_Value((Am_Value *)&obj_value.value);
      }
    }
    Am_Value::~Am_Value((Am_Value *)local_58);
  }
  Am_Object::~Am_Object((Am_Object *)&new_value.value);
LAB_0033930f:
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Mouse_Event_Method, void, sel_object,
                 (Am_Object inter, int mouse_x, int mouse_y, Am_Object ref_obj,
                  Am_Input_Char ic))
{
  Am_Object new_object;
  if (inter.Valid()) {
    Am_Object widget = inter.Get_Owner();
    clear_multi_selections(widget);
    new_object = inter.Get(Am_START_OBJECT);
    if (new_object.Valid()) {
      Am_Value new_value;
      bool toggle_in_set = ic.shift;
      if (new_object == widget) {     // then clicked in the background
        if (toggle_in_set) {          //  don't do anything
          Am_Abort_Interactor(inter); //make sure not queued for undo
          return;
        } else { // select nothing
          Am_INTER_TRACE_PRINT(widget, "Selection handle setting empty for "
                                           << widget);
          new_object = nullptr; //so object_modified will be null
          new_value = Am_Value_List();
        }
      } else { // over a specific object
        Am_Value value;
        value = widget.Peek(Am_SELECT_CLOSEST_POINT_STYLE);
        bool abort_ok = true;
        if (value.Valid()) {
          Am_Where_Method method = widget.Get(Am_SELECT_CLOSEST_POINT_METHOD);
          Am_Object diff_obj =
              method.Call(widget, new_object, ref_obj, mouse_x, mouse_y);
          if (diff_obj.Valid())
            abort_ok = false;
        }
        Am_Value_List list;
        list = widget.Get(Am_VALUE);
        list.Start();
        if (toggle_in_set)
          toggle_object_in_list(widget, new_object, list);
        else { //if object is selected, do nothing, otherwise,
          // make new_object be the only selection
          if (list.Member(new_object)) { //nothing to do if already selected
            if (abort_ok) {
              Am_Abort_Interactor(inter); //make sure not queued for undo
              return;
            }
          } else {
            Am_INTER_TRACE_PRINT(widget, "Selection handle setting "
                                             << widget << " to contain only "
                                             << new_object);
            list.Make_Empty();
            list.Add(new_object);
          }
        }
        new_value = list;
      }
      Am_Value old_value;
      old_value = widget.Peek(Am_VALUE);
      widget.Set(Am_VALUE, new_value);
      Am_Value obj_value = Am_Value(new_object);
      set_commands_for_sel(Am_No_Object, inter, widget, obj_value, new_value,
                           old_value, true, "Select");
    }
  }
}